

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
CheckPackageMempoolAcceptResult_abi_cxx11_
          (Package *txns,PackageMempoolAcceptResult *result,bool expect_valid,CTxMemPool *mempool)

{
  ResultType RVar1;
  initializer_list<uint256> __l;
  bool bVar2;
  PackageValidationResult PVar3;
  uint uVar4;
  TxValidationResult TVar5;
  size_type sVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  uint256 *puVar9;
  byte in_CL;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDI
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  byte bVar10;
  bool bVar11;
  shared_ptr<const_CTransaction> *tx_ref;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range3;
  bool txid_in_mempool;
  bool valid_or_reconsiderable;
  bool diff_witness;
  bool mempool_entry;
  bool valid;
  mapped_type *atmp_result;
  Wtxid *wtxid;
  shared_ptr<const_CTransaction> *tx;
  Package *__range1;
  const_iterator __end3;
  const_iterator __begin3;
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  cluster;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  CTransaction *in_stack_fffffffffffff938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff940;
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  *in_stack_fffffffffffff948;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  key_type *in_stack_fffffffffffff958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff968;
  char **args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff970;
  ValidationState<PackageValidationResult> *in_stack_fffffffffffff978;
  char *fmt;
  undefined8 in_stack_fffffffffffff980;
  undefined7 in_stack_fffffffffffff988;
  undefined1 in_stack_fffffffffffff98f;
  undefined7 in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff99f;
  undefined2 in_stack_fffffffffffff9a4;
  undefined1 uVar12;
  undefined1 in_stack_fffffffffffff9a7;
  bool local_651;
  vector<uint256,_std::allocator<uint256>_> *txids;
  undefined7 in_stack_fffffffffffffa58;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a0 [5];
  char *local_3d0 [13];
  char local_368 [384];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_CL & 1) == 0) {
    bVar2 = ValidationState<PackageValidationResult>::IsValid
                      ((ValidationState<PackageValidationResult> *)in_stack_fffffffffffff938);
    if (bVar2) {
      ValidationState<PackageValidationResult>::ToString_abi_cxx11_(in_stack_fffffffffffff978);
      tinyformat::format<std::__cxx11::string>
                ((char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      goto LAB_00ec1723;
    }
  }
  else {
    bVar2 = ValidationState<PackageValidationResult>::IsInvalid
                      ((ValidationState<PackageValidationResult> *)in_stack_fffffffffffff938);
    if (bVar2) {
      ValidationState<PackageValidationResult>::ToString_abi_cxx11_(in_stack_fffffffffffff978);
      tinyformat::format<std::__cxx11::string>
                ((char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      goto LAB_00ec1723;
    }
  }
  PVar3 = ValidationState<PackageValidationResult>::GetResult
                    ((ValidationState<PackageValidationResult> *)in_stack_fffffffffffff938);
  if (PVar3 != PCKG_POLICY) {
    sVar6 = std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_fffffffffffff938);
    sVar7 = std::
            map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            ::size((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)in_stack_fffffffffffff938);
    if (sVar6 != sVar7) {
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_fffffffffffff938);
      std::
      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::size((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              *)in_stack_fffffffffffff938);
      tinyformat::format<unsigned_long,unsigned_long>
                ((char *)in_stack_fffffffffffff978,(unsigned_long *)in_stack_fffffffffffff970,
                 (unsigned_long *)in_stack_fffffffffffff968);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      goto LAB_00ec1723;
    }
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)in_stack_fffffffffffff940);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)in_stack_fffffffffffff940);
  while (bVar2 = __gnu_cxx::
                 operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                           ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)in_stack_fffffffffffff948,
                            (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)in_stack_fffffffffffff940), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)in_stack_fffffffffffff938);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffff938);
    CTransaction::GetWitnessHash(in_stack_fffffffffffff938);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<true> *)in_stack_fffffffffffff938);
    sVar7 = std::
            map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            ::count(in_stack_fffffffffffff948,(key_type *)in_stack_fffffffffffff940);
    if (sVar7 == 0) {
      transaction_identifier<true>::ToString_abi_cxx11_
                ((transaction_identifier<true> *)in_stack_fffffffffffff940);
      tinyformat::format<std::__cxx11::string>
                ((char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      goto LAB_00ec1723;
    }
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<true> *)in_stack_fffffffffffff938);
    pmVar8 = std::
             map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::at((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    bVar10 = pmVar8->m_result_type == VALID;
    if (((in_CL & 1) != 0) &&
       (bVar2 = ValidationState<TxValidationResult>::IsInvalid
                          ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff938), bVar2)
       ) {
      transaction_identifier<true>::ToString_abi_cxx11_
                ((transaction_identifier<true> *)in_stack_fffffffffffff940);
      ValidationState<TxValidationResult>::ToString_abi_cxx11_
                ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff978);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                ((char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                 in_stack_fffffffffffff968);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      goto LAB_00ec1723;
    }
    sVar6 = std::__cxx11::
            list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::size((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_fffffffffffff938);
    if (100 < sVar6) {
      transaction_identifier<true>::ToString_abi_cxx11_
                ((transaction_identifier<true> *)in_stack_fffffffffffff940);
      tinyformat::format<std::__cxx11::string>
                ((char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      goto LAB_00ec1723;
    }
    bVar2 = std::__cxx11::
            list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::empty((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)in_stack_fffffffffffff938);
    if ((!bVar2) &&
       (bVar2 = std::
                optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                ::has_value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                             *)in_stack_fffffffffffff938), bVar2)) {
      std::
      optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
      ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
               *)in_stack_fffffffffffff948);
      sVar6 = std::
              vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
              size((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)in_stack_fffffffffffff938);
      if (2 < sVar6) {
        transaction_identifier<true>::ToString_abi_cxx11_
                  ((transaction_identifier<true> *)in_stack_fffffffffffff940);
        tinyformat::format<std::__cxx11::string>
                  ((char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff938);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff938);
        goto LAB_00ec1723;
      }
    }
    bVar2 = std::__cxx11::
            list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::empty((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)in_stack_fffffffffffff938);
    if ((!bVar2) &&
       (in_R8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff938);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff978,
                 (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff970,
                 (char *)in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,
                 (int)((ulong)in_stack_fffffffffffff958 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffff958 >> 0x18,0));
      bVar2 = std::
              optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              ::has_value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                           *)in_stack_fffffffffffff938);
      if (bVar2) {
        std::
        optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
        ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                 *)in_stack_fffffffffffff948);
        sVar6 = std::
                vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ::size((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                        *)in_stack_fffffffffffff938);
        if (sVar6 != 2) goto LAB_00ec0d7d;
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffff938);
        CTransaction::GetHash(in_stack_fffffffffffff938);
        puVar9 = transaction_identifier::operator_cast_to_uint256_
                           ((transaction_identifier<false> *)in_stack_fffffffffffff938);
        local_1e8 = *(undefined8 *)(puVar9->super_base_blob<256U>).m_data._M_elems;
        uStack_1e0 = *(undefined8 *)((puVar9->super_base_blob<256U>).m_data._M_elems + 8);
        local_1d8 = *(undefined8 *)((puVar9->super_base_blob<256U>).m_data._M_elems + 0x10);
        uStack_1d0 = *(undefined8 *)((puVar9->super_base_blob<256U>).m_data._M_elems + 0x18);
        txids = (vector<uint256,_std::allocator<uint256>_> *)0x1;
        std::allocator<uint256>::allocator((allocator<uint256> *)in_stack_fffffffffffff938);
        __l._M_len._0_7_ = in_stack_fffffffffffff988;
        __l._M_array = (iterator)in_stack_fffffffffffff980;
        __l._M_len._7_1_ = in_stack_fffffffffffff98f;
        std::vector<uint256,_std::allocator<uint256>_>::vector
                  ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff978,__l,
                   (allocator_type *)in_stack_fffffffffffff970);
        CTxMemPool::GatherClusters((CTxMemPool *)CONCAT17(bVar10,in_stack_fffffffffffffa58),txids);
        std::vector<uint256,_std::allocator<uint256>_>::~vector
                  ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff948);
        std::allocator<uint256>::~allocator((allocator<uint256> *)in_stack_fffffffffffff938);
        sVar6 = std::
                vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                ::size((vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                        *)in_stack_fffffffffffff938);
        bVar2 = sVar6 != 2;
        if (bVar2) {
          transaction_identifier<true>::ToString_abi_cxx11_
                    ((transaction_identifier<true> *)in_stack_fffffffffffff940);
          tinyformat::format<std::__cxx11::string>
                    ((char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff938);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff938);
        }
        std::
        vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
        ::~vector((vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                   *)in_stack_fffffffffffff948);
        if (!bVar2) goto LAB_00ec0d7d;
      }
      else {
LAB_00ec0d7d:
        bVar2 = false;
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff938);
      if (bVar2) goto LAB_00ec1723;
    }
    bVar11 = pmVar8->m_result_type == MEMPOOL_ENTRY;
    bVar2 = std::optional<long>::has_value((optional<long> *)in_stack_fffffffffffff938);
    local_651 = (bVar10 & 1) != 0 || bVar11;
    if (bVar2 != local_651) {
      transaction_identifier<true>::ToString_abi_cxx11_
                ((transaction_identifier<true> *)in_stack_fffffffffffff940);
      tinyformat::format<std::__cxx11::string,char_const*>
                ((char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                 (char **)in_stack_fffffffffffff968);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      goto LAB_00ec1723;
    }
    bVar2 = std::optional<long>::has_value((optional<long> *)in_stack_fffffffffffff938);
    uVar4 = (uint)bVar2;
    uVar12 = (bVar10 & 1) != 0 || bVar11;
    if (uVar4 != (byte)uVar12) {
      transaction_identifier<true>::ToString_abi_cxx11_
                ((transaction_identifier<true> *)in_stack_fffffffffffff940);
      tinyformat::format<std::__cxx11::string,char_const*>
                ((char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                 (char **)in_stack_fffffffffffff968);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      goto LAB_00ec1723;
    }
    RVar1 = pmVar8->m_result_type;
    bVar2 = std::optional<uint256>::has_value((optional<uint256> *)in_stack_fffffffffffff938);
    if (bVar2 != (RVar1 == DIFFERENT_WITNESS)) {
      transaction_identifier<true>::ToString_abi_cxx11_
                ((transaction_identifier<true> *)in_stack_fffffffffffff940);
      tinyformat::format<std::__cxx11::string,char_const*>
                ((char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                 (char **)in_stack_fffffffffffff968);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      goto LAB_00ec1723;
    }
    bVar2 = true;
    if (pmVar8->m_result_type != VALID) {
      TVar5 = ValidationState<TxValidationResult>::GetResult
                        ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff938);
      bVar2 = TVar5 == TX_RECONSIDERABLE;
    }
    in_stack_fffffffffffff98f = bVar2;
    bVar11 = std::optional<CFeeRate>::has_value((optional<CFeeRate> *)in_stack_fffffffffffff938);
    if (bVar11 != bVar2) {
      transaction_identifier<true>::ToString_abi_cxx11_
                ((transaction_identifier<true> *)in_stack_fffffffffffff940);
      tinyformat::format<std::__cxx11::string,char_const*>
                ((char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                 (char **)in_stack_fffffffffffff968);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      goto LAB_00ec1723;
    }
    bVar11 = std::
             optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
             ::has_value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                          *)in_stack_fffffffffffff938);
    if (bVar11 != bVar2) {
      fmt = local_368;
      transaction_identifier<true>::ToString_abi_cxx11_
                ((transaction_identifier<true> *)in_stack_fffffffffffff940);
      tinyformat::format<std::__cxx11::string,char_const*>
                (fmt,in_stack_fffffffffffff970,(char **)in_stack_fffffffffffff968);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff938);
      goto LAB_00ec1723;
    }
    if (in_R8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      RVar1 = pmVar8->m_result_type;
      in_stack_fffffffffffff970 = in_R8;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffff938);
      CTransaction::GetHash(in_stack_fffffffffffff938);
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<false> *)in_stack_fffffffffffff938);
      GenTxid::Txid((uint256 *)in_stack_fffffffffffff938);
      bVar2 = CTxMemPool::exists((CTxMemPool *)
                                 CONCAT17(in_stack_fffffffffffff9a7,
                                          CONCAT16(uVar12,CONCAT24(in_stack_fffffffffffff9a4,uVar4))
                                         ),
                                 (GenTxid *)
                                 CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
      if (bVar2 != (RVar1 != INVALID)) {
        args_1 = local_3d0;
        transaction_identifier<true>::ToString_abi_cxx11_
                  ((transaction_identifier<true> *)in_stack_fffffffffffff940);
        tinyformat::format<std::__cxx11::string,char_const*>
                  ((char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970,args_1);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff938);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff938);
        goto LAB_00ec1723;
      }
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffff938);
      bVar2 = CTransaction::HasWitness(in_stack_fffffffffffff938);
      if ((bVar2) && (pmVar8->m_result_type == DIFFERENT_WITNESS)) {
        in_stack_fffffffffffff960 = in_R8;
        transaction_identifier::operator_cast_to_uint256_
                  ((transaction_identifier<true> *)in_stack_fffffffffffff938);
        GenTxid::Wtxid((uint256 *)in_stack_fffffffffffff938);
        bVar2 = CTxMemPool::exists((CTxMemPool *)
                                   CONCAT17(in_stack_fffffffffffff9a7,
                                            CONCAT16(uVar12,CONCAT24(in_stack_fffffffffffff9a4,uVar4
                                                                    ))),
                                   (GenTxid *)
                                   CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
        if (bVar2) {
          transaction_identifier<true>::ToString_abi_cxx11_
                    ((transaction_identifier<true> *)in_stack_fffffffffffff940);
          tinyformat::format<std::__cxx11::string>
                    ((char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff938);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff938);
          goto LAB_00ec1723;
        }
      }
      std::__cxx11::
      list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::begin((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)in_stack_fffffffffffff940);
      std::__cxx11::
      list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::end((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_fffffffffffff940);
      while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffff948,
                                     (_Self *)in_stack_fffffffffffff940), ((bVar2 ^ 0xffU) & 1) != 0
            ) {
        std::_List_const_iterator<std::shared_ptr<const_CTransaction>_>::operator*
                  ((_List_const_iterator<std::shared_ptr<const_CTransaction>_> *)
                   in_stack_fffffffffffff938);
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffff938);
        CTransaction::GetHash(in_stack_fffffffffffff938);
        transaction_identifier::operator_cast_to_uint256_
                  ((transaction_identifier<false> *)in_stack_fffffffffffff938);
        GenTxid::Txid((uint256 *)in_stack_fffffffffffff938);
        bVar2 = CTxMemPool::exists((CTxMemPool *)
                                   CONCAT17(in_stack_fffffffffffff9a7,
                                            CONCAT16(uVar12,CONCAT24(in_stack_fffffffffffff9a4,uVar4
                                                                    ))),
                                   (GenTxid *)
                                   CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
        if (bVar2) {
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffff938);
          CTransaction::GetWitnessHash(in_stack_fffffffffffff938);
          this = local_4a0;
          transaction_identifier<true>::ToString_abi_cxx11_
                    ((transaction_identifier<true> *)in_stack_fffffffffffff940);
          tinyformat::format<std::__cxx11::string>
                    ((char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (this,in_stack_fffffffffffff940);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff938);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff938);
          goto LAB_00ec1723;
        }
        std::_List_const_iterator<std::shared_ptr<const_CTransaction>_>::operator++
                  ((_List_const_iterator<std::shared_ptr<const_CTransaction>_> *)
                   in_stack_fffffffffffff938);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)in_stack_fffffffffffff938);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(in_RDI);
LAB_00ec1723:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> CheckPackageMempoolAcceptResult(const Package& txns,
                                                           const PackageMempoolAcceptResult& result,
                                                           bool expect_valid,
                                                           const CTxMemPool* mempool)
{
    if (expect_valid) {
        if (result.m_state.IsInvalid()) {
            return strprintf("Package validation unexpectedly failed: %s", result.m_state.ToString());
        }
    } else {
        if (result.m_state.IsValid()) {
            return strprintf("Package validation unexpectedly succeeded. %s", result.m_state.ToString());
        }
    }
    if (result.m_state.GetResult() != PackageValidationResult::PCKG_POLICY && txns.size() != result.m_tx_results.size()) {
        return strprintf("txns size %u does not match tx results size %u", txns.size(), result.m_tx_results.size());
    }
    for (const auto& tx : txns) {
        const auto& wtxid = tx->GetWitnessHash();
        if (result.m_tx_results.count(wtxid) == 0) {
            return strprintf("result not found for tx %s", wtxid.ToString());
        }

        const auto& atmp_result = result.m_tx_results.at(wtxid);
        const bool valid{atmp_result.m_result_type == MempoolAcceptResult::ResultType::VALID};
        if (expect_valid && atmp_result.m_state.IsInvalid()) {
            return strprintf("tx %s unexpectedly failed: %s", wtxid.ToString(), atmp_result.m_state.ToString());
        }

        // Each subpackage is allowed MAX_REPLACEMENT_CANDIDATES replacements (only checking individually here)
        if (atmp_result.m_replaced_transactions.size() > MAX_REPLACEMENT_CANDIDATES) {
            return strprintf("tx %s result replaced too many transactions",
                                wtxid.ToString());
        }

        // Replacements can't happen for subpackages larger than 2
        if (!atmp_result.m_replaced_transactions.empty() &&
            atmp_result.m_wtxids_fee_calculations.has_value() && atmp_result.m_wtxids_fee_calculations.value().size() > 2) {
             return strprintf("tx %s was part of a too-large package RBF subpackage",
                                wtxid.ToString());
        }

        if (!atmp_result.m_replaced_transactions.empty() && mempool) {
            LOCK(mempool->cs);
            // If replacements occurred and it used 2 transactions, this is a package RBF and should result in a cluster of size 2
            if (atmp_result.m_wtxids_fee_calculations.has_value() && atmp_result.m_wtxids_fee_calculations.value().size() == 2) {
                const auto cluster = mempool->GatherClusters({tx->GetHash()});
                if (cluster.size() != 2) return strprintf("tx %s has too many ancestors or descendants for a package rbf", wtxid.ToString());
            }
        }

        // m_vsize and m_base_fees should exist iff the result was VALID or MEMPOOL_ENTRY
        const bool mempool_entry{atmp_result.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY};
        if (atmp_result.m_base_fees.has_value() != (valid || mempool_entry)) {
            return strprintf("tx %s result should %shave m_base_fees", wtxid.ToString(), valid || mempool_entry ? "" : "not ");
        }
        if (atmp_result.m_vsize.has_value() != (valid || mempool_entry)) {
            return strprintf("tx %s result should %shave m_vsize", wtxid.ToString(), valid || mempool_entry ? "" : "not ");
        }

        // m_other_wtxid should exist iff the result was DIFFERENT_WITNESS
        const bool diff_witness{atmp_result.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS};
        if (atmp_result.m_other_wtxid.has_value() != diff_witness) {
            return strprintf("tx %s result should %shave m_other_wtxid", wtxid.ToString(), diff_witness ? "" : "not ");
        }

        // m_effective_feerate and m_wtxids_fee_calculations should exist iff the result was valid
        // or if the failure was TX_RECONSIDERABLE
        const bool valid_or_reconsiderable{atmp_result.m_result_type == MempoolAcceptResult::ResultType::VALID ||
                    atmp_result.m_state.GetResult() == TxValidationResult::TX_RECONSIDERABLE};
        if (atmp_result.m_effective_feerate.has_value() != valid_or_reconsiderable) {
            return strprintf("tx %s result should %shave m_effective_feerate",
                                    wtxid.ToString(), valid ? "" : "not ");
        }
        if (atmp_result.m_wtxids_fee_calculations.has_value() != valid_or_reconsiderable) {
            return strprintf("tx %s result should %shave m_effective_feerate",
                                    wtxid.ToString(), valid ? "" : "not ");
        }

        if (mempool) {
            // The tx by txid should be in the mempool iff the result was not INVALID.
            const bool txid_in_mempool{atmp_result.m_result_type != MempoolAcceptResult::ResultType::INVALID};
            if (mempool->exists(GenTxid::Txid(tx->GetHash())) != txid_in_mempool) {
                return strprintf("tx %s should %sbe in mempool", wtxid.ToString(), txid_in_mempool ? "" : "not ");
            }
            // Additionally, if the result was DIFFERENT_WITNESS, we shouldn't be able to find the tx in mempool by wtxid.
            if (tx->HasWitness() && atmp_result.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS) {
                if (mempool->exists(GenTxid::Wtxid(wtxid))) {
                    return strprintf("wtxid %s should not be in mempool", wtxid.ToString());
                }
            }
            for (const auto& tx_ref : atmp_result.m_replaced_transactions) {
                if (mempool->exists(GenTxid::Txid(tx_ref->GetHash()))) {
                    return strprintf("tx %s should not be in mempool as it was replaced", tx_ref->GetWitnessHash().ToString());
                }
            }
        }
    }
    return std::nullopt;
}